

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_32x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int txfm1d_size;
  code *pcVar1;
  code *pcVar2;
  uint size;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x03',&cfg);
  pcVar1 = fdct32_sse4_1;
  pcVar2 = fdct32_sse4_1;
  if (cfg.txfm_type_col != '\x03') {
    if (cfg.txfm_type_col == '\v') {
      pcVar2 = idtx32x32_sse4_1;
    }
    else if (cfg.txfm_type_col == '\x04') {
      pcVar2 = fdct64_new_sse4_1;
    }
    else {
      pcVar2 = (code *)0x0;
    }
  }
  txfm1d_size = tx_size_wide[cfg.tx_size];
  if (cfg.txfm_type_row != '\x03') {
    if (cfg.txfm_type_row == '\v') {
      pcVar1 = idtx32x32_sse4_1;
    }
    else if (cfg.txfm_type_row == '\x04') {
      pcVar1 = fdct64_new_sse4_1;
    }
    else {
      pcVar1 = (code *)0x0;
    }
  }
  size = (uint)(txfm1d_size * txfm1d_size) >> 2;
  int16_array_with_stride_to_int32_array_without_stride(input,stride,txfm_buf,txfm1d_size);
  av1_round_shift_array_32_sse4_1((__m128i *)txfm_buf,(__m128i *)output,size,-(int)*cfg.shift);
  (*pcVar2)(output,(__m128i *)txfm_buf,(int)cfg.cos_bit_col,cfg.stage_range_col);
  av1_round_shift_array_32_sse4_1((__m128i *)txfm_buf,(__m128i *)output,size,-(int)cfg.shift[1]);
  transpose_32(txfm1d_size,(__m128i *)output,(__m128i *)txfm_buf);
  (*pcVar1)((__m128i *)txfm_buf,output,(int)cfg.cos_bit_row,cfg.stage_range_row);
  av1_round_shift_array_32_sse4_1((__m128i *)output,(__m128i *)output,size,-(int)cfg.shift[2]);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[1024]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_32X32, &cfg);
  (void)bd;
  fwd_txfm2d_sse4_1(input, output, stride, &cfg, txfm_buf);
}